

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O3

Var Js::JavascriptObject::EntryDefineSetter(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  Var pvVar6;
  Var argument;
  int in_stack_00000010;
  undefined1 local_80 [8];
  PropertyDescriptor propertyDescriptor;
  PropertyRecord *propertyRecord;
  CallInfo callInfo_local;
  ArgumentReader args;
  RecyclableObject *obj;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  propertyRecord = (PropertyRecord *)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x5ab,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00ce3f45;
    *puVar5 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  callInfo_local = callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)&callInfo_local,(CallInfo *)&propertyRecord);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)propertyRecord & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x5ae,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
LAB_00ce3f45:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  args.super_Arguments.Values = (Type)0x0;
  pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,0);
  BVar4 = JavascriptConversion::ToObject
                    (pvVar6,pSVar1,(RecyclableObject **)&args.super_Arguments.Values);
  if (BVar4 == 0) {
    JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec42,L"Object.prototype.__defineSetter__");
  }
  if ((callInfo_local._0_4_ & 0xffffff) < 3) {
    pvVar6 = *(Var *)(*(long *)((long)args.super_Arguments.Values[1] + 8) + 0x430);
  }
  else {
    pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,2);
  }
  bVar3 = JavascriptConversion::IsCallable(pvVar6);
  if (bVar3) {
    if (((ulong)callInfo_local & 0xfffffe) == 0) {
      argument = *(Var *)(*(long *)((long)args.super_Arguments.Values[1] + 8) + 0x430);
    }
    else {
      argument = Arguments::operator[]((Arguments *)&callInfo_local,1);
    }
    JavascriptConversion::ToPropertyKey
              (argument,pSVar1,(PropertyRecord **)&propertyDescriptor.Configurable,
               (PropertyString **)0x0);
    PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_80);
    PropertyDescriptor::SetEnumerable((PropertyDescriptor *)local_80,true);
    PropertyDescriptor::SetConfigurable((PropertyDescriptor *)local_80,true);
    PropertyDescriptor::SetSetter((PropertyDescriptor *)local_80,pvVar6);
    DefineOwnPropertyHelper
              ((RecyclableObject *)args.super_Arguments.Values,
               *(PropertyId *)(propertyDescriptor._40_8_ + 8),(PropertyDescriptor *)local_80,pSVar1,
               true);
    return *(Var *)(*(long *)((long)args.super_Arguments.Values[1] + 8) + 0x430);
  }
  JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec34,L"Object.prototype.__defineSetter__");
}

Assistant:

Var JavascriptObject::EntryDefineSetter(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();

    Assert(!(callInfo.Flags & CallFlags_New));

    // For browser interop, simulate LdThis by calling OP implementation directly.
    // Do not have module id here so use the global id, 0.
    //
    RecyclableObject* obj = nullptr;
    if (!JavascriptConversion::ToObject(args[0], scriptContext, &obj))
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NullOrUndefined, _u("Object.prototype.__defineSetter__"));
    }

    Var setterFunc = args.Info.Count > 2 ? args[2] : obj->GetLibrary()->GetUndefined();

    if (!JavascriptConversion::IsCallable(setterFunc))
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("Object.prototype.__defineSetter__"));
    }

    Var propertyKey = args.Info.Count > 1 ? args[1] : obj->GetLibrary()->GetUndefined();
    const PropertyRecord* propertyRecord;
    JavascriptConversion::ToPropertyKey(propertyKey, scriptContext, &propertyRecord, nullptr);

    PropertyDescriptor propertyDescriptor;
    propertyDescriptor.SetEnumerable(true);
    propertyDescriptor.SetConfigurable(true);
    propertyDescriptor.SetSetter(setterFunc);

    DefineOwnPropertyHelper(obj, propertyRecord->GetPropertyId(), propertyDescriptor, scriptContext);

    return obj->GetLibrary()->GetUndefined();
}